

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O3

ReadFileResult
anon_unknown.dwarf_7475e5::ArchToolsetStrategyHelper
          (optional<cmCMakePresetsGraph::ArchToolsetStrategy> *out,Value *value)

{
  bool bVar1;
  int iVar2;
  _Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> _Var3;
  ReadFileResult RVar4;
  String local_48;
  
  if (value == (Value *)0x0) {
    RVar4 = READ_OK;
    if ((out->super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>)._M_payload
        .super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>._M_engaged == true)
    {
      (out->super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>)._M_payload.
      super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>._M_engaged = false;
    }
  }
  else {
    bVar1 = Json::Value::isString(value);
    RVar4 = INVALID_PRESET;
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_48,value);
      iVar2 = std::__cxx11::string::compare((char *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 == 0) {
        _Var3._M_payload = (_Storage<cmCMakePresetsGraph::ArchToolsetStrategy,_true>)0x0;
        _Var3._M_engaged = true;
        _Var3._5_3_ = 0;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_48,value);
        iVar2 = std::__cxx11::string::compare((char *)&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if (iVar2 != 0) {
          return INVALID_PRESET;
        }
        _Var3._M_payload = (_Storage<cmCMakePresetsGraph::ArchToolsetStrategy,_true>)0x1;
        _Var3._M_engaged = true;
        _Var3._5_3_ = 0;
      }
      (out->super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>)._M_payload.
      super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> = _Var3;
      RVar4 = READ_OK;
    }
  }
  return RVar4;
}

Assistant:

ReadFileResult ArchToolsetStrategyHelper(
  cm::optional<ArchToolsetStrategy>& out, const Json::Value* value)
{
  if (!value) {
    out = cm::nullopt;
    return ReadFileResult::READ_OK;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "set") {
    out = ArchToolsetStrategy::Set;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "external") {
    out = ArchToolsetStrategy::External;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}